

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.cpp
# Opt level: O3

String __thiscall xmrig::Buffer::toHex(Buffer *this)

{
  size_t size;
  uint8_t *out;
  size_t sVar1;
  size_t in_RDX;
  size_t extraout_RDX;
  undefined8 *in_RSI;
  String SVar2;
  
  size = in_RSI[1];
  if (size == 0) {
    this->m_data = (char *)0x0;
    this->m_size = 0;
  }
  else {
    out = (uint8_t *)operator_new__(size * 2 + 1);
    out[size * 2] = '\0';
    toHex((uint8_t *)*in_RSI,size,out);
    this->m_data = (char *)out;
    sVar1 = strlen((char *)out);
    this->m_size = sVar1;
    in_RDX = extraout_RDX;
  }
  SVar2.m_size = in_RDX;
  SVar2.m_data = (char *)this;
  return SVar2;
}

Assistant:

xmrig::String xmrig::Buffer::toHex() const
{
    if (m_size == 0) {
        return String();
    }

    char *buf       = new char[m_size * 2 + 1];
    buf[m_size * 2] = '\0';

    toHex(m_data, m_size, buf);

    return String(buf);
}